

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O0

size_t lws_buflist_next_segment_len(lws_buflist **head,uint8_t **buf)

{
  lws_buflist *plVar1;
  int iVar2;
  lws_buflist *b;
  uint8_t **buf_local;
  lws_buflist **head_local;
  
  plVar1 = *head;
  if (buf != (uint8_t **)0x0) {
    *buf = (uint8_t *)0x0;
  }
  if (plVar1 == (lws_buflist *)0x0) {
    head_local = (lws_buflist **)0x0;
  }
  else if (((plVar1->len == 0) && (plVar1->next != (lws_buflist *)0x0)) &&
          (iVar2 = lws_buflist_destroy_segment(head), iVar2 != 0)) {
    head_local = (lws_buflist **)0x0;
  }
  else {
    plVar1 = *head;
    if (plVar1 == (lws_buflist *)0x0) {
      head_local = (lws_buflist **)0x0;
    }
    else {
      if (plVar1->len <= plVar1->pos) {
        __assert_fail("b->pos < b->len",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core/buflist.c"
                      ,0x82,"size_t lws_buflist_next_segment_len(struct lws_buflist **, uint8_t **)"
                     );
      }
      if (buf != (uint8_t **)0x0) {
        *buf = (uint8_t *)((long)&plVar1[1].pos + plVar1->pos);
      }
      head_local = (lws_buflist **)(plVar1->len - plVar1->pos);
    }
  }
  return (size_t)head_local;
}

Assistant:

size_t
lws_buflist_next_segment_len(struct lws_buflist **head, uint8_t **buf)
{
	struct lws_buflist *b = (*head);

	if (buf)
		*buf = NULL;

	if (!b)
		return 0;	/* there is no next segment len */

	if (!b->len && b->next)
		if (lws_buflist_destroy_segment(head))
			return 0;

	b = (*head);
	if (!b)
		return 0;	/* there is no next segment len */

	assert(b->pos < b->len);

	if (buf)
		*buf = ((uint8_t *)b) + sizeof(*b) + b->pos + LWS_PRE;

	return b->len - b->pos;
}